

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CreateDefaultClassAssignment
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  TypeClass *type;
  MemberHandle *pMVar1;
  Allocator *pAVar2;
  ScopeData *scope;
  TypeBase *pTVar3;
  TypeBase *pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  VariableData *pVVar7;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  int iVar8;
  int iVar9;
  ExprBase *pEVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TypeFunction *pTVar13;
  TypeRef *contextType;
  ArgumentData *val;
  SynBase *source_00;
  ExprVariableDefinition *pEVar14;
  ExprBase *pEVar15;
  undefined4 extraout_var_05;
  _func_int **pp_Var16;
  undefined4 extraout_var_07;
  SmallArray<FunctionValue,_32U> *functions_00;
  IntrusiveList<MemberHandle> *pIVar17;
  char *pcVar18;
  IntrusiveList<MemberHandle> *pIVar19;
  uint i;
  uint uVar20;
  bool bVar21;
  ArrayView<FunctionValue> functions_01;
  ArrayView<FunctionValue> functions_02;
  ArrayView<ArgumentData> arguments_02;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_03;
  InplaceStr name_00;
  InplaceStr name_01;
  InplaceStr name_02;
  InplaceStr name_03;
  InplaceStr name_04;
  FunctionValue bestOverload;
  IntrusiveList<VariableHandle> customAssignMembers;
  IntrusiveList<ExprBase> expressions;
  undefined4 uStack_4ac;
  undefined4 uStack_49c;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<ArgumentData,_2U> arguments;
  SmallArray<FunctionValue,_32U> functions;
  VariableHandle *pVVar11;
  FunctionData *pFVar12;
  undefined4 extraout_var_06;
  
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  type = classDefinition->classType;
  functions_00 = (SmallArray<FunctionValue,_32U> *)&customAssignMembers;
  customAssignMembers.head = (VariableHandle *)0x0;
  customAssignMembers.tail = (VariableHandle *)0x0;
  pIVar19 = &(type->super_TypeStruct).members;
  pIVar17 = pIVar19;
  do {
    pMVar1 = pIVar17->head;
    if (pMVar1 == (MemberHandle *)0x0) {
      if (customAssignMembers.head != (VariableHandle *)0x0) {
        SmallArray<ArgumentData,_2U>::SmallArray
                  ((SmallArray<ArgumentData,_2U> *)&functions,ctx->allocator);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_00.end = "";
        name_00.begin = "$left";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar8),name_00);
        ratings.little._8_8_ = ExpressionContext::GetReferenceType(ctx,(TypeBase *)type);
        ratings._8_8_ = ratings._8_8_ & 0xffffffffffffff00;
        ratings.little[4] = 0;
        ratings.little[5] = 0;
        ratings.little[6] = 0;
        ratings.little[7] = 0;
        ratings.data = (uint *)source;
        ratings.little._0_8_ = (SynIdentifier *)CONCAT44(extraout_var_01,iVar8);
        SmallArray<ArgumentData,_2U>::push_back
                  ((SmallArray<ArgumentData,_2U> *)&functions,(ArgumentData *)&ratings);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_01.end = "";
        name_01.begin = "$right";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_02,iVar8),name_01);
        ratings._8_8_ = ratings._8_8_ & 0xffffffffffffff00;
        ratings.little[4] = 0;
        ratings.little[5] = 0;
        ratings.little[6] = 0;
        ratings.little[7] = 0;
        ratings.data = (uint *)source;
        ratings.little._0_8_ = (SynIdentifier *)CONCAT44(extraout_var_02,iVar8);
        ratings.little._8_8_ = type;
        SmallArray<ArgumentData,_2U>::push_back
                  ((SmallArray<ArgumentData,_2U> *)&functions,(ArgumentData *)&ratings);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        name_02.end = "";
        name_02.begin = "default_assign$_";
        SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_03,iVar8),name_02);
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
        pFVar12 = (FunctionData *)CONCAT44(extraout_var_04,iVar9);
        pAVar2 = ctx->allocator;
        scope = ctx->scope;
        arguments_02.count = functions.count;
        arguments_02.data = (ArgumentData *)functions.data;
        arguments_02._12_4_ = 0;
        pTVar13 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_02);
        contextType = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
        uVar20 = ctx->uniqueFunctionId;
        ctx->uniqueFunctionId = uVar20 + 1;
        pcVar18 = (char *)0x0;
        FunctionData::FunctionData
                  (pFVar12,pAVar2,source,scope,false,false,false,pTVar13,
                   &contextType->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var_03,iVar8),
                   (IntrusiveList<MatchData>)ZEXT816(0),uVar20);
        type->defaultAssign = pFVar12;
        for (uVar20 = 0; uVar20 < functions.count; uVar20 = uVar20 + 1) {
          val = SmallArray<ArgumentData,_2U>::operator[]
                          ((SmallArray<ArgumentData,_2U> *)&functions,uVar20);
          SmallArray<ArgumentData,_4U>::push_back(&pFVar12->arguments,val);
        }
        name.end = pcVar18;
        name.begin = (pFVar12->name->name).end;
        anon_unknown.dwarf_ff84f::CheckFunctionConflict
                  ((anon_unknown_dwarf_ff84f *)ctx,(ExpressionContext *)source,
                   (SynBase *)(pFVar12->name->name).begin,name);
        ExpressionContext::AddFunction(ctx,pFVar12);
        ExpressionContext::PushScope(ctx,pFVar12);
        pFVar12->functionScope = ctx->scope;
        bestOverload.source = (SynBase *)0x0;
        bestOverload.function = (FunctionData *)0x0;
        arguments_03.count = functions.count;
        arguments_03.data = (ArgumentData *)functions.data;
        arguments_03._12_4_ = 0;
        CreateFunctionArgumentVariables
                  (ctx,source,pFVar12,arguments_03,
                   (IntrusiveList<ExprVariableDefinition> *)&bestOverload);
        source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        pEVar14 = CreateFunctionContextArgument(ctx,source_00,pFVar12);
        pFVar12->argumentsSize = pFVar12->functionScope->dataSize;
        expressions.head = (ExprBase *)0x0;
        expressions.tail = (ExprBase *)0x0;
        while (pMVar1 = pIVar19->head, pMVar1 != (MemberHandle *)0x0) {
          pEVar10 = CreateVariableAccess
                              (ctx,source,*(VariableData **)&(bestOverload.source)->next->typeID,
                               false);
          pEVar10 = CreateMemberAccess(ctx,source,pEVar10,pMVar1->variable->name,false);
          pEVar15 = CreateVariableAccess
                              (ctx,source,
                               *(VariableData **)
                                (*(long *)(((bestOverload.source)->pos).begin + 0x30) + 8),false);
          pEVar15 = CreateMemberAccess(ctx,source,pEVar15,pMVar1->variable->name,false);
          pEVar10 = CreateAssignment(ctx,source,pEVar10,pEVar15);
          IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
          pIVar19 = (IntrusiveList<MemberHandle> *)&pMVar1->next;
        }
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
        pTVar3 = ctx->typeVoid;
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pp_Var16 = (_func_int **)CONCAT44(extraout_var_06,iVar8);
        pTVar4 = ctx->typeVoid;
        *(undefined4 *)(pp_Var16 + 1) = 2;
        pp_Var16[2] = (_func_int *)source;
        pp_Var16[3] = (_func_int *)pTVar4;
        pp_Var16[4] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var16 + 5) = 0;
        *pp_Var16 = (_func_int *)&PTR__ExprBase_003e3b40;
        pEVar10->typeID = 0x1c;
        pEVar10->source = source;
        pEVar10->type = pTVar3;
        pEVar10->next = (ExprBase *)0x0;
        pEVar10->listed = false;
        pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3670;
        pEVar10[1]._vptr_ExprBase = pp_Var16;
        *(undefined8 *)&pEVar10[1].typeID = 0;
        pEVar10[1].source = (SynBase *)0x0;
        IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
        ClosePendingUpvalues(ctx,pFVar12);
        ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
        pEVar10 = (ExprBase *)CONCAT44(extraout_var_07,iVar8);
        pTVar13 = pFVar12->type;
        arguments.data = (ArgumentData *)bestOverload.source;
        arguments._8_8_ = bestOverload.function;
        ratings.data = (uint *)expressions.head;
        ratings._8_8_ = expressions.tail;
        pEVar10->typeID = 0x24;
        pEVar10->source = source;
        pEVar10->type = &pTVar13->super_TypeBase;
        pEVar10->next = (ExprBase *)0x0;
        pEVar10->listed = false;
        pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e36a8;
        pEVar10[1]._vptr_ExprBase = (_func_int **)pFVar12;
        *(ExprVariableDefinition **)&pEVar10[1].typeID = pEVar14;
        pEVar10[1].source = bestOverload.source;
        pEVar10[1].type = (TypeBase *)bestOverload.function;
        pEVar10[1].next = (ExprBase *)0x0;
        *(ExprBase **)&pEVar10[1].listed = expressions.head;
        pEVar10[2]._vptr_ExprBase = (_func_int **)expressions.tail;
        *(undefined8 *)&pEVar10[2].typeID = 0;
        pEVar10[2].source = (SynBase *)0x0;
        pFVar12->declaration = pEVar10;
        SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&pFVar12->declaration);
        IntrusiveList<ExprBase>::push_back(&classDefinition->functions,pFVar12->declaration);
        SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)&functions);
      }
      RestoreParentTypeScope(ctx,source,(TypeBase *)classDefinition->classType);
      return;
    }
    pFVar12 = (FunctionData *)pMVar1->variable->type;
    if (((pFVar12 == (FunctionData *)0x0) || (0x15 < *(uint *)&pFVar12->importModule)) ||
       (functions_00 = (SmallArray<FunctionValue,_32U> *)(BYTE_ARRAY_003bffad + 0x54),
       (0x3c0001U >> (*(uint *)&pFVar12->importModule & 0x1f) & 1) == 0)) {
      SmallArray<ArgumentData,_2U>::SmallArray(&arguments,ctx->allocator);
      functions.little[0].function =
           (FunctionData *)ExpressionContext::GetReferenceType(ctx,(TypeBase *)pFVar12);
      functions.count = functions.count & 0xffffff00;
      functions.little[0].source = (SynBase *)0x0;
      functions.little[0].context = (ExprBase *)0x0;
      functions.little[1].source = (SynBase *)0x0;
      functions.data = (FunctionValue *)source;
      SmallArray<ArgumentData,_2U>::push_back(&arguments,(ArgumentData *)&functions);
      functions.count = functions.count & 0xffffff00;
      functions.little[0].source = (SynBase *)0x0;
      functions.little[0].context = (ExprBase *)0x0;
      functions.little[1].source = (SynBase *)0x0;
      functions.data = (FunctionValue *)source;
      functions.little[0].function = pFVar12;
      SmallArray<ArgumentData,_2U>::push_back(&arguments,(ArgumentData *)&functions);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = functions_00;
      name_03.end = "";
      name_03.begin = "=";
      pEVar10 = CreateVariableAccess
                          (ctx,source,(IntrusiveList<SynIdentifier>)(auVar5 << 0x40),name_03,false);
      if (pEVar10 == (ExprBase *)0x0) {
LAB_001dae74:
        auVar6._8_8_ = 0;
        auVar6._0_8_ = functions_00;
        name_04.end = "";
        name_04.begin = "default_assign$_";
        pEVar10 = CreateVariableAccess
                            (ctx,source,(IntrusiveList<SynIdentifier>)(auVar6 << 0x40),name_04,false
                            );
        if (pEVar10 != (ExprBase *)0x0) {
          pAVar2 = ctx->allocator;
          memset(functions.little,0,0x300);
          functions.count = 0;
          functions.max = 0x20;
          functions_00 = &functions;
          functions.data = functions.little;
          functions.allocator = pAVar2;
          GetNodeFunctions(ctx,source,pEVar10,functions_00);
          if (functions.count != 0) {
            ratings.allocator = ctx->allocator;
            ratings.data = ratings.little;
            ratings.count = 0;
            ratings.max = 0x20;
            arguments_01._12_4_ = uStack_4ac;
            arguments_01.count = arguments.count;
            arguments_01.data = arguments.data;
            functions_02.count = functions.count;
            functions_02.data = functions.data;
            functions_02._12_4_ = 0;
            functions_00 = (SmallArray<FunctionValue,_32U> *)functions.data;
            SelectBestFunction(&bestOverload,ctx,source,functions_02,
                               (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_01,&ratings);
            if (bestOverload.function != (FunctionData *)0x0) {
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar11 = (VariableHandle *)CONCAT44(extraout_var_00,iVar8);
              pVVar7 = pMVar1->variable;
              pVVar11->source = pMVar1->source;
              pVVar11->variable = pVVar7;
              pVVar11->next = (VariableHandle *)0x0;
              pVVar11->listed = false;
              IntrusiveList<VariableHandle>::push_back(&customAssignMembers,pVVar11);
            }
            SmallArray<unsigned_int,_32U>::~SmallArray(&ratings);
          }
          SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
        }
      }
      else {
        pAVar2 = ctx->allocator;
        memset(functions.little,0,0x300);
        functions.count = 0;
        functions.max = 0x20;
        functions_00 = &functions;
        functions.data = functions.little;
        functions.allocator = pAVar2;
        GetNodeFunctions(ctx,source,pEVar10,functions_00);
        if (functions.count == 0) {
LAB_001dae58:
          bVar21 = false;
        }
        else {
          ratings.allocator = ctx->allocator;
          ratings.data = ratings.little;
          ratings.count = 0;
          ratings.max = 0x20;
          arguments_00._12_4_ = uStack_49c;
          arguments_00.count = arguments.count;
          arguments_00.data = arguments.data;
          functions_01.count = functions.count;
          functions_01.data = functions.data;
          functions_01._12_4_ = 0;
          functions_00 = (SmallArray<FunctionValue,_32U> *)functions.data;
          SelectBestFunction(&bestOverload,ctx,source,functions_01,
                             (IntrusiveList<TypeHandle>)ZEXT816(0),arguments_00,&ratings);
          pFVar12 = bestOverload.function;
          bVar21 = bestOverload.function != (FunctionData *)0x0;
          if (bVar21) {
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pVVar11 = (VariableHandle *)CONCAT44(extraout_var,iVar8);
            pVVar7 = pMVar1->variable;
            pVVar11->source = pMVar1->source;
            pVVar11->variable = pVVar7;
            pVVar11->next = (VariableHandle *)0x0;
            pVVar11->listed = false;
            IntrusiveList<VariableHandle>::push_back(&customAssignMembers,pVVar11);
          }
          SmallArray<unsigned_int,_32U>::~SmallArray(&ratings);
          if (pFVar12 == (FunctionData *)0x0) goto LAB_001dae58;
        }
        SmallArray<FunctionValue,_32U>::~SmallArray(&functions);
        if (!bVar21) goto LAB_001dae74;
      }
      SmallArray<ArgumentData,_2U>::~SmallArray(&arguments);
    }
    pIVar17 = (IntrusiveList<MemberHandle> *)&pMVar1->next;
  } while( true );
}

Assistant:

void CreateDefaultClassAssignment(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	ctx.PopScope(SCOPE_TYPE);

	TypeClass *classType = classDefinition->classType;

	IntrusiveList<VariableHandle> customAssignMembers;

	for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
	{
		TypeBase *type = curr->variable->type;

		if(isType<TypeRef>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeError>(type))
			continue;

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, NULL, ctx.GetReferenceType(type), NULL));
		arguments.push_back(ArgumentData(source, false, NULL, type, NULL));

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("="), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("default_assign$_"), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}
	}

	if(!customAssignMembers.empty())
	{
		InplaceStr functionName = InplaceStr("default_assign$_");

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$left")), ctx.GetReferenceType(classType), NULL));
		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$right")), classType, NULL));

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		classType->defaultAssign = function;

		// Fill in argument data
		for(unsigned i = 0; i < arguments.size(); i++)
			function->arguments.push_back(arguments[i]);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		IntrusiveList<ExprVariableDefinition> variables;

		CreateFunctionArgumentVariables(ctx, source, function, arguments, variables);

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
		{
			VariableData *leftArgument = variables.head->variable->variable;

			ExprBase *left = CreateVariableAccess(ctx, source, leftArgument, false);

			ExprBase *leftMember = CreateMemberAccess(ctx, source, left, curr->variable->name, false);

			VariableData *rightArgument = getType<ExprVariableDefinition>(variables.head->next)->variable->variable;

			ExprBase *right = CreateVariableAccess(ctx, source, rightArgument, false);

			ExprBase *rightMember = CreateMemberAccess(ctx, source, right, curr->variable->name, false);

			expressions.push_back(CreateAssignment(ctx, source, leftMember, rightMember));
		}

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, NULL));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);
	}

	RestoreParentTypeScope(ctx, source, classDefinition->classType);
}